

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

int xmlValidGetPotentialChildren(xmlElementContent *ctree,xmlChar **names,int *len,int max)

{
  xmlChar *str1;
  int iVar1;
  long lVar2;
  
  if (len == (int *)0x0 || (names == (xmlChar **)0x0 || ctree == (xmlElementContent *)0x0)) {
    iVar1 = -1;
  }
  else {
    iVar1 = *len;
    if (iVar1 < max) {
      switch(ctree->type) {
      case XML_ELEMENT_CONTENT_PCDATA:
        lVar2 = 0;
        do {
          iVar1 = *len;
          if (iVar1 <= lVar2) {
            *len = iVar1 + 1;
            names[iVar1] = (xmlChar *)"#PCDATA";
            break;
          }
          iVar1 = xmlStrEqual((xmlChar *)"#PCDATA",names[lVar2]);
          lVar2 = lVar2 + 1;
        } while (iVar1 == 0);
        break;
      case XML_ELEMENT_CONTENT_ELEMENT:
        lVar2 = 0;
        do {
          iVar1 = *len;
          str1 = ctree->name;
          if (iVar1 <= lVar2) {
            *len = iVar1 + 1;
            names[iVar1] = str1;
            break;
          }
          iVar1 = xmlStrEqual(str1,names[lVar2]);
          lVar2 = lVar2 + 1;
        } while (iVar1 == 0);
        break;
      case XML_ELEMENT_CONTENT_SEQ:
      case XML_ELEMENT_CONTENT_OR:
        xmlValidGetPotentialChildren(ctree->c1,names,len,max);
        xmlValidGetPotentialChildren(ctree->c2,names,len,max);
      }
      iVar1 = *len;
    }
  }
  return iVar1;
}

Assistant:

int
xmlValidGetPotentialChildren(xmlElementContent *ctree,
                             const xmlChar **names,
                             int *len, int max) {
    int i;

    if ((ctree == NULL) || (names == NULL) || (len == NULL))
        return(-1);
    if (*len >= max) return(*len);

    switch (ctree->type) {
	case XML_ELEMENT_CONTENT_PCDATA:
	    for (i = 0; i < *len;i++)
		if (xmlStrEqual(BAD_CAST "#PCDATA", names[i])) return(*len);
	    names[(*len)++] = BAD_CAST "#PCDATA";
	    break;
	case XML_ELEMENT_CONTENT_ELEMENT:
	    for (i = 0; i < *len;i++)
		if (xmlStrEqual(ctree->name, names[i])) return(*len);
	    names[(*len)++] = ctree->name;
	    break;
	case XML_ELEMENT_CONTENT_SEQ:
	    xmlValidGetPotentialChildren(ctree->c1, names, len, max);
	    xmlValidGetPotentialChildren(ctree->c2, names, len, max);
	    break;
	case XML_ELEMENT_CONTENT_OR:
	    xmlValidGetPotentialChildren(ctree->c1, names, len, max);
	    xmlValidGetPotentialChildren(ctree->c2, names, len, max);
	    break;
   }

   return(*len);
}